

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned-mem-pool.h
# Opt level: O2

void * cnn::cnn_mm_malloc(size_t n,size_t align)

{
  int iVar1;
  ostream *poVar2;
  out_of_memory *this;
  size_t __alignment;
  allocator local_39;
  string local_38;
  
  if (align == 1) {
    local_38._M_dataplus._M_p = (pointer)malloc(n);
  }
  else {
    __alignment = 8;
    if (8 < align) {
      __alignment = align;
    }
    if ((align - 1 & align) != 0) {
      __alignment = align;
    }
    iVar1 = posix_memalign((void **)&local_38,__alignment,n);
    if (iVar1 != 0) goto LAB_001dfc76;
  }
  if (local_38._M_dataplus._M_p != (pointer)0x0) {
    return local_38._M_dataplus._M_p;
  }
LAB_001dfc76:
  poVar2 = std::operator<<((ostream *)&std::cerr,"Memory allocation failed n=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," align=");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (out_of_memory *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_38,"Memory allocation failed in cnn_mm_malloc()",&local_39);
  out_of_memory::out_of_memory(this,&local_38);
  __cxa_throw(this,&out_of_memory::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void* cnn_mm_malloc(size_t n, size_t align) {
  void* ptr = nullptr;
#if HAVE_CUDA
  CUDA_CHECK(cudaMalloc(&ptr, n));
#else
  ptr = _mm_malloc(n, align);
#endif
  if (!ptr) {
    std::cerr << "Memory allocation failed n=" << n << " align=" << align << std::endl;
    throw cnn::out_of_memory("Memory allocation failed in cnn_mm_malloc()");
  }
  return ptr;
}